

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall trieste::SymtabDef::str(SymtabDef *this,ostream *out,size_t level)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  char *pcVar3;
  pointer psVar4;
  char cVar5;
  ostream *poVar6;
  size_t sVar7;
  _Base_ptr p_Var8;
  iterator __begin3;
  _Base_ptr p_Var9;
  shared_ptr<trieste::NodeDef> *node_1;
  size_t sVar10;
  long lVar11;
  pointer psVar12;
  string_view sVar13;
  
  sVar10 = level;
  if (level != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"{",1);
  p_Var8 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  cVar5 = (char)out;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar5);
      std::ostream::put(cVar5);
      poVar6 = (ostream *)std::ostream::flush();
      lVar11 = level + 1;
      if (level != 0xffffffffffffffff) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      sVar13 = Location::view((Location *)(p_Var8 + 1));
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,sVar13._M_str,sVar13._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," =",2);
      p_Var9 = *(_Base_ptr *)(p_Var8 + 2);
      p_Var2 = p_Var8[2]._M_parent;
      if ((long)p_Var2 - (long)p_Var9 == 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," ",1);
        pcVar3 = *(char **)(p_Var8[2]._M_parent[-1]._M_left)->_M_left;
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)out + (int)out->_vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,pcVar3,sVar7);
        }
      }
      else {
        for (; p_Var9 != p_Var2; p_Var9 = (_Base_ptr)&p_Var9->_M_left) {
          std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar5);
          std::ostream::put(cVar5);
          poVar6 = (ostream *)std::ostream::flush();
          for (lVar11 = level + 2; lVar11 != 0; lVar11 = lVar11 + -1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
          }
          pcVar3 = (char *)**(undefined8 **)(*(long *)p_Var9 + 0x10);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
          }
          else {
            sVar7 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar7);
          }
        }
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  psVar12 = (this->includes).
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->includes).
           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar12 != psVar4) {
    do {
      std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar5);
      std::ostream::put(cVar5);
      poVar6 = (ostream *)std::ostream::flush();
      lVar11 = level + 1;
      if (level != 0xffffffffffffffff) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"include ",8);
      sVar13 = Location::view(&((psVar12->
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->location_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,sVar13._M_str,sVar13._M_len);
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"}",1);
  return;
}

Assistant:

inline void SymtabDef::str(std::ostream& out, size_t level)
  {
    out << indent(level) << "{";

    for (auto& [loc, sym] : symbols)
    {
      out << std::endl << indent(level + 1) << loc.view() << " =";

      if (sym.size() == 1)
      {
        out << " " << sym.back()->type().str();
      }
      else
      {
        for (auto& node : sym)
          out << std::endl << indent(level + 2) << node->type().str();
      }
    }

    for (auto& node : includes)
    {
      out << std::endl
          << indent(level + 1) << "include " << node->location().view();
    }

    out << "}";
  }